

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O0

int is_vdso(link_map *map)

{
  link_map *plVar1;
  link_map *result;
  link_map *map_local;
  
  if (map == (link_map *)0x0) {
    map_local._4_4_ = 0;
  }
  else if (is_vdso::vdso_checked == 0) {
    is_vdso::vdso_checked = 1;
    plVar1 = get_vdso_from_aliases();
    if (plVar1 == (link_map *)0x0) {
      plVar1 = get_vdso_from_auxv();
      if (plVar1 == (link_map *)0x0) {
        plVar1 = get_vdso_from_maps();
        if (plVar1 == (link_map *)0x0) {
          map_local._4_4_ = 0;
        }
        else {
          map_local._4_4_ = (uint)(map == plVar1);
          is_vdso::vdso = plVar1;
        }
      }
      else {
        map_local._4_4_ = (uint)(map == plVar1);
        is_vdso::vdso = plVar1;
      }
    }
    else {
      map_local._4_4_ = (uint)(map == plVar1);
      is_vdso::vdso = plVar1;
    }
  }
  else {
    map_local._4_4_ = (uint)(map == is_vdso::vdso);
  }
  return map_local._4_4_;
}

Assistant:

int is_vdso(const struct link_map *map) {
  static int vdso_checked = 0;
  static struct link_map *vdso = NULL;
  struct link_map *result = NULL;

  if (!map) return 0;
  if (vdso_checked) return (map == vdso);

  vdso_checked = 1;

  result = get_vdso_from_aliases();
  if (result) {
    vdso = result;         // GCOVR_EXCL_LINE
    return (map == vdso);  // GCOVR_EXCL_LINE
  }

  result = get_vdso_from_auxv();
  if (result) {
    vdso = result;
    return (map == vdso);
  }

  result = get_vdso_from_maps();  // GCOVR_EXCL_START
  if (result) {
    vdso = result;
    return (map == vdso);
  }

  return 0;
}